

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

bool wasm::PossibleContents::isSubContents(PossibleContents *a,PossibleContents *b)

{
  bool bVar1;
  Type left;
  Type right;
  Type local_28;
  PossibleContents *local_20;
  PossibleContents *b_local;
  PossibleContents *a_local;
  
  local_20 = b;
  b_local = a;
  bVar1 = isFullConeType(b);
  if (bVar1) {
    bVar1 = isNone(b_local);
    if (bVar1) {
      a_local._7_1_ = true;
    }
    else {
      bVar1 = isMany(b_local);
      if (bVar1) {
        a_local._7_1_ = false;
      }
      else {
        bVar1 = isNull(b_local);
        if (bVar1) {
          local_28 = getType(local_20);
          a_local._7_1_ = wasm::Type::isNullable(&local_28);
        }
        else {
          left = getType(b_local);
          right = getType(local_20);
          a_local._7_1_ = wasm::Type::isSubType(left,right);
        }
      }
    }
  }
  else {
    bVar1 = isFullConeType(b_local);
    if (!bVar1) {
      handle_unreachable("a or b must be a full cone",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                         ,0x176);
    }
    a_local._7_1_ = isMany(local_20);
  }
  return a_local._7_1_;
}

Assistant:

bool PossibleContents::isSubContents(const PossibleContents& a,
                                     const PossibleContents& b) {
  // TODO: Everything else. For now we only call this when |a| or |b| is a full
  //       cone type.
  if (b.isFullConeType()) {
    if (a.isNone()) {
      return true;
    }
    if (a.isMany()) {
      return false;
    }
    if (a.isNull()) {
      return b.getType().isNullable();
    }
    return Type::isSubType(a.getType(), b.getType());
  }

  if (a.isFullConeType()) {
    // We've already ruled out b being a full cone type before, so the only way
    // |a| can be contained in |b| is if |b| is everything.
    return b.isMany();
  }

  WASM_UNREACHABLE("a or b must be a full cone");
}